

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O1

void __thiscall
miniscript::Node<XOnlyPubKey>::Node
          (Node<XOnlyPubKey> *this,MiniscriptContext param_2,Fragment param_3,undefined8 *param_4,
          uint32_t param_5)

{
  long lVar1;
  pointer psVar2;
  Type TVar3;
  size_t sVar4;
  long in_FS_OFFSET;
  WitnessSize WVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->fragment = param_3;
  this->k = param_5;
  (this->keys).super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->keys).super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->keys).super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar2 = (pointer)param_4[1];
  (this->subs).
  super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)*param_4;
  (this->subs).
  super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar2;
  (this->subs).
  super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)param_4[2];
  *param_4 = 0;
  param_4[1] = 0;
  param_4[2] = 0;
  this->m_script_ctx = param_2;
  CalcOps(&this->ops,this);
  CalcStackSize(&this->ss,this);
  WVar5 = CalcWitnessSize(this);
  this->ws = WVar5;
  TVar3 = CalcType(this);
  (this->typ).m_flags = TVar3.m_flags;
  sVar4 = CalcScriptLen(this);
  this->scriptlen = sVar4;
  (this->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool>._M_engaged = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Node(internal::NoDupCheck, MiniscriptContext script_ctx, Fragment nt, std::vector<NodeRef<Key>> sub, uint32_t val = 0)
        : fragment(nt), k(val), subs(std::move(sub)), m_script_ctx{script_ctx}, ops(CalcOps()), ss(CalcStackSize()), ws(CalcWitnessSize()), typ(CalcType()), scriptlen(CalcScriptLen()) {}